

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monster_test_json_parser.h
# Opt level: O2

char * MyGame_Example_int_enum_parse_json_enum
                 (flatcc_json_parser_t *ctx,char *buf,char *end,int *value_sign,uint64_t *value,
                 int *aggregate)

{
  uint64_t uVar1;
  char *pcVar2;
  int iVar3;
  uint64_t uStack_40;
  
  uVar1 = flatcc_json_parser_symbol_part(buf,end);
  if ((uint)(uVar1 >> 0x21) < 0x34b73a19) {
    if ((uVar1 & 0x7fffffff00000000) != 0x696e743100000000) {
      return buf;
    }
    pcVar2 = flatcc_json_parser_match_constant(ctx,buf,end,4,aggregate);
    if (pcVar2 == buf) {
      return buf;
    }
    iVar3 = 0;
    uStack_40 = 2;
  }
  else if (uVar1 < 0x696e746e65670000) {
    if ((uVar1 & 0x7fffffff00000000) != 0x696e743200000000) {
      return buf;
    }
    pcVar2 = flatcc_json_parser_match_constant(ctx,buf,end,4,aggregate);
    if (pcVar2 == buf) {
      return buf;
    }
    iVar3 = 0;
    uStack_40 = 0x2a;
  }
  else if ((uVar1 & 0xffffffffffffff00) == 0x696e746e65673200) {
    pcVar2 = flatcc_json_parser_match_constant(ctx,buf,end,7,aggregate);
    if (pcVar2 == buf) {
      return buf;
    }
    iVar3 = 1;
    uStack_40 = 0xffffffffffffffff;
  }
  else {
    if ((uVar1 & 0xffffffffffff0000) != 0x696e746e65670000) {
      return buf;
    }
    pcVar2 = flatcc_json_parser_match_constant(ctx,buf,end,6,aggregate);
    if (pcVar2 == buf) {
      return buf;
    }
    iVar3 = 1;
    uStack_40 = 0xfffffffffffffffe;
  }
  *value = uStack_40;
  *value_sign = iVar3;
  return pcVar2;
}

Assistant:

static const char *MyGame_Example_int_enum_parse_json_enum(flatcc_json_parser_t *ctx, const char *buf, const char *end,
        int *value_sign, uint64_t *value, int *aggregate)
{
    const char *unmatched = buf;
    const char *mark;
    uint64_t w;

    w = flatcc_json_parser_symbol_part(buf, end);
    if (w < 0x696e743200000000) { /* branch "int2" */
        if ((w & 0xffffffff00000000) == 0x696e743100000000) { /* "int1" */
            buf = flatcc_json_parser_match_constant(ctx, (mark = buf), end, 4, aggregate);
            if (buf != mark) {
                *value = UINT64_C(2), *value_sign = 0;
            } else {
                return unmatched;
            }
        } else { /* "int1" */
            return unmatched;
        } /* "int1" */
    } else { /* branch "int2" */
        if (w < 0x696e746e65670000) { /* branch "intneg" */
            if ((w & 0xffffffff00000000) == 0x696e743200000000) { /* "int2" */
                buf = flatcc_json_parser_match_constant(ctx, (mark = buf), end, 4, aggregate);
                if (buf != mark) {
                    *value = UINT64_C(42), *value_sign = 0;
                } else {
                    return unmatched;
                }
            } else { /* "int2" */
                return unmatched;
            } /* "int2" */
        } else { /* branch "intneg" */
            if ((w & 0xffffffffffffff00) == 0x696e746e65673200) { /* "intneg2" */
                buf = flatcc_json_parser_match_constant(ctx, (mark = buf), end, 7, aggregate);
                if (buf != mark) {
                    *value = UINT64_C(18446744073709551615), *value_sign = 1;
                } else {
                    return unmatched;
                }
            } else { /* "intneg2" */
                if ((w & 0xffffffffffff0000) == 0x696e746e65670000) { /* "intneg" */
                    buf = flatcc_json_parser_match_constant(ctx, (mark = buf), end, 6, aggregate);
                    if (buf != mark) {
                        *value = UINT64_C(18446744073709551614), *value_sign = 1;
                    } else {
                        return unmatched;
                    }
                } else { /* "intneg" */
                    return unmatched;
                } /* "intneg" */
            } /* "intneg2" */
        } /* branch "intneg" */
    } /* branch "int2" */
    return buf;
}